

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ChainPromiseNode::get(ChainPromiseNode *this,ExceptionOrValue *output)

{
  Fault f;
  Fault FStack_8;
  
  if (*(int *)&(this->super_Event).field_0x24 == 1) {
    (*((this->inner).ptr)->_vptr_PromiseNode[2])();
    return;
  }
  Debug::Fault::Fault(&FStack_8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
                      ,0x34e,FAILED,"state == STEP2","");
  Debug::Fault::fatal(&FStack_8);
}

Assistant:

void ChainPromiseNode::get(ExceptionOrValue& output) noexcept {
  KJ_REQUIRE(state == STEP2);
  return inner->get(output);
}